

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O3

Error asmjit::VirtMem::releaseDualMapping(DualMapping *dm,size_t size)

{
  int iVar1;
  Error EVar2;
  bool bVar3;
  
  iVar1 = munmap(dm->ro,size);
  bVar3 = iVar1 != 0;
  if (dm->ro != dm->rw) {
    iVar1 = munmap(dm->rw,size);
    bVar3 = bVar3 || iVar1 != 0;
  }
  EVar2 = 2;
  if (!bVar3) {
    dm->ro = (void *)0x0;
    dm->rw = (void *)0x0;
    EVar2 = 0;
  }
  return EVar2;
}

Assistant:

Error VirtMem::releaseDualMapping(DualMapping* dm, size_t size) noexcept {
  Error err = release(dm->ro, size);
  if (dm->ro != dm->rw)
    err |= release(dm->rw, size);

  if (err)
    return DebugUtils::errored(kErrorInvalidArgument);

  dm->ro = nullptr;
  dm->rw = nullptr;
  return kErrorOk;
}